

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void finalizeAggFunctions(Parse *pParse,AggInfo *pAggInfo)

{
  ExprList *pEVar1;
  FuncDef *p;
  long lVar2;
  int iVar3;
  int iVar4;
  Vdbe *v;
  AggInfo_func *pAVar5;
  
  if (0 < pAggInfo->nFunc) {
    pAVar5 = pAggInfo->aFunc;
    iVar4 = 0;
    do {
      pEVar1 = (pAVar5->pExpr->x).pList;
      iVar3 = 0;
      if (pEVar1 != (ExprList *)0x0) {
        iVar3 = pEVar1->nExpr;
      }
      sqlite3VdbeAddOp3((Vdbe *)pParse,0x9d,pAVar5->iMem,iVar3,0);
      p = pAVar5->pFunc;
      if (pParse->db->mallocFailed == '\0') {
        lVar2 = *(long *)&pParse->nTableLock;
        iVar3 = *(int *)&pParse->aTableLock;
        *(undefined1 *)(lVar2 + -0x17 + (long)iVar3 * 0x18) = 0xf8;
        *(FuncDef **)(lVar2 + -8 + (long)iVar3 * 0x18) = p;
      }
      else if ((p->funcFlags & 0x10) != 0) {
        sqlite3DbFreeNN(pParse->db,p);
      }
      iVar4 = iVar4 + 1;
      pAVar5 = pAVar5 + 1;
    } while (iVar4 < pAggInfo->nFunc);
  }
  return;
}

Assistant:

static void finalizeAggFunctions(Parse *pParse, AggInfo *pAggInfo){
  Vdbe *v = pParse->pVdbe;
  int i;
  struct AggInfo_func *pF;
  for(i=0, pF=pAggInfo->aFunc; i<pAggInfo->nFunc; i++, pF++){
    ExprList *pList = pF->pExpr->x.pList;
    assert( !ExprHasProperty(pF->pExpr, EP_xIsSelect) );
    sqlite3VdbeAddOp2(v, OP_AggFinal, pF->iMem, pList ? pList->nExpr : 0);
    sqlite3VdbeAppendP4(v, pF->pFunc, P4_FUNCDEF);
  }
}